

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  u8 uVar1;
  Select *pSVar2;
  u8 uVar3;
  
  uVar1 = pVector->op;
  uVar3 = uVar1;
  if (uVar1 == 0x9d) {
    uVar3 = pVector->op2;
  }
  if (uVar3 == 'w') {
    pSVar2 = (pVector->x).pSelect;
  }
  else {
    if (uVar3 != 0x9e) {
      return pVector;
    }
    pSVar2 = (Select *)&pVector->x;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar2->pEList)->pList->nExpr) {
    if ((uVar1 == 'w') || (pVector->op2 == 'w')) {
      pSVar2 = (pVector->x).pSelect;
    }
    else {
      pSVar2 = (Select *)&pVector->x;
    }
    pVector = pSVar2->pEList->a[i].pExpr;
  }
  return pVector;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}